

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PartialPivLU.h
# Opt level: O0

Index Eigen::internal::partial_lu_impl<double,_0,_int,_-1>::unblocked_lu
                (MatrixTypeRef *lu,int *row_transpositions,int *nb_transpositions)

{
  int *this;
  VariableAndFixedInt<_1> cRows;
  VariableAndFixedInt<_1> cCols;
  long *plVar1;
  Scalar *other;
  Type local_510;
  Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>
  *local_4d8;
  int local_4cc;
  RowXpr local_4c8;
  Type local_490;
  int local_424;
  ColXpr local_420;
  Type local_3e8;
  Product<Eigen::Block<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,_1,_true>,__1,_1,_false>,_Eigen::Block<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_false>,_1,__1,_false>,_0>
  local_380;
  int local_2ac;
  ColXpr local_2a8;
  Type local_270;
  RowXpr local_208;
  RowXpr local_1d0;
  scalar_score_coeff_op<double> local_191;
  ColXpr local_190;
  Type local_158;
  CwiseUnaryOp<Eigen::internal::scalar_score_coeff_op<double>,_const_Eigen::Block<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,_1,_true>,__1,_1,_false>_>
  local_f0;
  Scalar local_80;
  Score biggest_in_corner;
  Index row_of_biggest_in_col;
  int local_64;
  long lStack_60;
  int rcols;
  int local_54;
  Score SStack_50;
  int rrows;
  Index k;
  Index first_zero_pivot;
  Index endk;
  Index size;
  Index cols;
  Index rows;
  int *nb_transpositions_local;
  int *row_transpositions_local;
  MatrixTypeRef *lu_local;
  
  rows = (Index)nb_transpositions;
  nb_transpositions_local = row_transpositions;
  row_transpositions_local = (int *)lu;
  cols = MapBase<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_0>
         ::rows((MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                 *)lu);
  size = MapBase<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_0>
         ::cols((MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                 *)row_transpositions_local);
  plVar1 = std::min<long>(&cols,&size);
  first_zero_pivot = *plVar1;
  *(undefined4 *)rows = 0;
  k = -1;
  endk = first_zero_pivot;
  for (SStack_50 = 0.0; (long)SStack_50 < first_zero_pivot; SStack_50 = (Score)((long)SStack_50 + 1)
      ) {
    lStack_60 = (cols - (long)SStack_50) + -1;
    local_54 = convert_index<int,long>(&stack0xffffffffffffffa0);
    row_of_biggest_in_col = (size - (long)SStack_50) + -1;
    local_64 = convert_index<int,long>(&row_of_biggest_in_col);
    DenseBase<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>_>::
    col(&local_190,
        (DenseBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
         *)row_transpositions_local,(Index)SStack_50);
    DenseBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_-1,_1,_true>_>
    ::tail<long>(&local_158,
                 (DenseBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,_1,_true>_>
                  *)&local_190,cols - (long)SStack_50);
    scalar_score_coeff_op<double>::scalar_score_coeff_op(&local_191);
    DenseBase<Eigen::Block<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,-1,-1,0,-1,-1>,0,Eigen::OuterStride<-1>>,-1,1,true>,-1,1,false>>
    ::unaryExpr<Eigen::internal::scalar_score_coeff_op<double>>(&local_f0,&local_158,&local_191);
    local_80 = DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_score_coeff_op<double>,_const_Eigen::Block<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_-1,_1,_true>,_-1,_1,_false>_>_>
               ::maxCoeff<long>((DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_score_coeff_op<double>,_const_Eigen::Block<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,_1,_true>,__1,_1,_false>_>_>
                                 *)&local_f0,(long *)&biggest_in_corner);
    biggest_in_corner = (Score)((long)SStack_50 + (long)biggest_in_corner);
    nb_transpositions_local[(long)SStack_50] = SUB84(biggest_in_corner,0);
    if ((local_80 != 0.0) || (NAN(local_80))) {
      if (SStack_50 != biggest_in_corner) {
        DenseBase<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>_>
        ::row(&local_1d0,
              (DenseBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
               *)row_transpositions_local,(Index)SStack_50);
        DenseBase<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>_>
        ::row(&local_208,
              (DenseBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
               *)row_transpositions_local,(Index)biggest_in_corner);
        DenseBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,-1,-1,0,-1,-1>,0,Eigen::OuterStride<-1>>,1,-1,false>>
        ::
        swap<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,_1,0,_1,_1>,0,Eigen::OuterStride<_1>>,1,_1,false>>
                  ((DenseBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,_1,0,_1,_1>,0,Eigen::OuterStride<_1>>,1,_1,false>>
                    *)&local_1d0,
                   (DenseBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_false>_>
                    *)&local_208);
        *(int *)rows = *(int *)rows + 1;
      }
      other = MapBase<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_0>
              ::coeff((MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                       *)row_transpositions_local,(Index)SStack_50,(Index)SStack_50);
      DenseBase<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>_>::
      col(&local_2a8,
          (DenseBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
           *)row_transpositions_local,(Index)SStack_50);
      local_2ac = (int)FixedInt<-1>::operator()((FixedInt<_1> *)&fix<_1>,local_54);
      DenseBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,-1,-1,0,-1,-1>,0,Eigen::OuterStride<-1>>,-1,1,true>>
      ::tail<Eigen::internal::VariableAndFixedInt<_1>>
                (&local_270,&local_2a8,(VariableAndFixedInt<_1>)local_2ac);
      DenseBase<Eigen::Block<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_-1,_1,_true>,_-1,_1,_false>_>
      ::operator/=((DenseBase<Eigen::Block<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,_1,_true>,__1,_1,_false>_>
                    *)&local_270,other);
    }
    else if (k == -1) {
      k = (Index)SStack_50;
    }
    if ((long)SStack_50 < cols + -1) {
      DenseBase<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>_>::
      col(&local_420,
          (DenseBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
           *)row_transpositions_local,(Index)SStack_50);
      local_424 = (int)FixedInt<-1>::operator()((FixedInt<_1> *)&fix<_1>,local_54);
      DenseBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,-1,-1,0,-1,-1>,0,Eigen::OuterStride<-1>>,-1,1,true>>
      ::tail<Eigen::internal::VariableAndFixedInt<_1>>
                (&local_3e8,&local_420,(VariableAndFixedInt<_1>)local_424);
      DenseBase<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>_>::
      row(&local_4c8,
          (DenseBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
           *)row_transpositions_local,(Index)SStack_50);
      local_4cc = (int)FixedInt<-1>::operator()((FixedInt<_1> *)&fix<_1>,local_64);
      DenseBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,-1,-1,0,-1,-1>,0,Eigen::OuterStride<-1>>,1,-1,false>>
      ::tail<Eigen::internal::VariableAndFixedInt<_1>>
                (&local_490,
                 (DenseBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,_1,0,_1,_1>,0,Eigen::OuterStride<_1>>,1,_1,false>>
                  *)&local_4c8,(VariableAndFixedInt<_1>)local_4cc);
      MatrixBase<Eigen::Block<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,-1,-1,0,-1,-1>,0,Eigen::OuterStride<-1>>,-1,1,true>,-1,1,false>>
      ::operator*(&local_380,
                  (MatrixBase<Eigen::Block<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,_1,0,_1,_1>,0,Eigen::OuterStride<_1>>,_1,1,true>,_1,1,false>>
                   *)&local_3e8,
                  (MatrixBase<Eigen::Block<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_false>,_1,__1,_false>_>
                   *)&local_490);
      this = row_transpositions_local;
      cRows = FixedInt<-1>::operator()((FixedInt<_1> *)&fix<_1>,local_54);
      cCols = FixedInt<-1>::operator()((FixedInt<_1> *)&fix<_1>,local_64);
      DenseBase<Eigen::Ref<Eigen::Matrix<double,-1,-1,0,-1,-1>,0,Eigen::OuterStride<-1>>>::
      bottomRightCorner<Eigen::internal::VariableAndFixedInt<_1>,Eigen::internal::VariableAndFixedInt<_1>>
                (&local_510,this,cRows,cCols);
      local_4d8 = (Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>
                   *)MatrixBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_-1,_-1,_false>_>
                     ::noalias((MatrixBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>_>
                                *)&local_510);
      NoAlias<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,-1,-1,0,-1,-1>,0,Eigen::OuterStride<-1>>,-1,-1,false>,Eigen::MatrixBase>
      ::operator-=((NoAlias<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,_1,0,_1,_1>,0,Eigen::OuterStride<_1>>,_1,_1,false>,Eigen::MatrixBase>
                    *)&local_4d8,
                   (MatrixBase<Eigen::Product<Eigen::Block<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,_1,_true>,__1,_1,_false>,_Eigen::Block<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_false>,_1,__1,_false>,_0>_>
                    *)&local_380);
    }
  }
  return k;
}

Assistant:

static Index unblocked_lu(MatrixTypeRef& lu, PivIndex* row_transpositions, PivIndex& nb_transpositions)
  {
    typedef scalar_score_coeff_op<Scalar> Scoring;
    typedef typename Scoring::result_type Score;
    const Index rows = lu.rows();
    const Index cols = lu.cols();
    const Index size = (std::min)(rows,cols);
    // For small compile-time matrices it is worth processing the last row separately:
    //  speedup: +100% for 2x2, +10% for others.
    const Index endk = UnBlockedAtCompileTime ? size-1 : size;
    nb_transpositions = 0;
    Index first_zero_pivot = -1;
    for(Index k = 0; k < endk; ++k)
    {
      int rrows = internal::convert_index<int>(rows-k-1);
      int rcols = internal::convert_index<int>(cols-k-1);

      Index row_of_biggest_in_col;
      Score biggest_in_corner
        = lu.col(k).tail(rows-k).unaryExpr(Scoring()).maxCoeff(&row_of_biggest_in_col);
      row_of_biggest_in_col += k;

      row_transpositions[k] = PivIndex(row_of_biggest_in_col);

      if(biggest_in_corner != Score(0))
      {
        if(k != row_of_biggest_in_col)
        {
          lu.row(k).swap(lu.row(row_of_biggest_in_col));
          ++nb_transpositions;
        }

        lu.col(k).tail(fix<RRows>(rrows)) /= lu.coeff(k,k);
      }
      else if(first_zero_pivot==-1)
      {
        // the pivot is exactly zero, we record the index of the first pivot which is exactly 0,
        // and continue the factorization such we still have A = PLU
        first_zero_pivot = k;
      }

      if(k<rows-1)
        lu.bottomRightCorner(fix<RRows>(rrows),fix<RCols>(rcols)).noalias() -= lu.col(k).tail(fix<RRows>(rrows)) * lu.row(k).tail(fix<RCols>(rcols));
    }

    // special handling of the last entry
    if(UnBlockedAtCompileTime)
    {
      Index k = endk;
      row_transpositions[k] = PivIndex(k);
      if (Scoring()(lu(k, k)) == Score(0) && first_zero_pivot == -1)
        first_zero_pivot = k;
    }

    return first_zero_pivot;
  }